

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2_impl.h
# Opt level: O0

uint32_t load32(void *src)

{
  uint8_t *p;
  void *src_local;
  
  return *src;
}

Assistant:

static BLAKE2_INLINE uint32_t load32( const void *src )
{
#if defined(NATIVE_LITTLE_ENDIAN)
  uint32_t w;
  memcpy(&w, src, sizeof w);
  return w;
#else
  const uint8_t *p = ( const uint8_t * )src;
  return (( uint32_t )( p[0] ) <<  0) |
         (( uint32_t )( p[1] ) <<  8) |
         (( uint32_t )( p[2] ) << 16) |
         (( uint32_t )( p[3] ) << 24) ;
#endif
}